

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O3

int64_t estimate_yrd_for_sb(AV1_COMP *cpi,BLOCK_SIZE bs,MACROBLOCK *x,int64_t ref_best_rd,
                           RD_STATS *rd_stats)

{
  MB_MODE_INFO *pMVar1;
  MB_MODE_INFO *pMVar2;
  int64_t iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t iVar7;
  
  iVar7 = 0x7fffffffffffffff;
  if (-1 < ref_best_rd) {
    av1_subtract_plane(x,bs,0);
    iVar3 = av1_estimate_txfm_yrd(cpi,x,rd_stats,ref_best_rd,bs,""[bs]);
    if (iVar3 != 0x7fffffffffffffff) {
      pMVar1 = (x->e_mbd).left_mbmi;
      pMVar2 = (x->e_mbd).above_mbmi;
      if (pMVar2 == (MB_MODE_INFO *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)pMVar2->skip_txfm;
      }
      if (pMVar1 == (MB_MODE_INFO *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)pMVar1->skip_txfm;
      }
      if (rd_stats->skip_txfm == '\0') {
        iVar4 = rd_stats->rate + (x->mode_costs).skip_txfm_cost[uVar6 + uVar5][0];
      }
      else {
        iVar4 = (x->mode_costs).skip_txfm_cost[uVar6 + uVar5][1];
      }
      rd_stats->rate = iVar4;
      iVar7 = iVar3;
    }
  }
  return iVar7;
}

Assistant:

static int64_t estimate_yrd_for_sb(const AV1_COMP *const cpi, BLOCK_SIZE bs,
                                   MACROBLOCK *x, int64_t ref_best_rd,
                                   RD_STATS *rd_stats) {
  MACROBLOCKD *const xd = &x->e_mbd;
  if (ref_best_rd < 0) return INT64_MAX;
  av1_subtract_plane(x, bs, 0);
  const int64_t rd = av1_estimate_txfm_yrd(cpi, x, rd_stats, ref_best_rd, bs,
                                           max_txsize_rect_lookup[bs]);
  if (rd != INT64_MAX) {
    const int skip_ctx = av1_get_skip_txfm_context(xd);
    if (rd_stats->skip_txfm) {
      const int s1 = x->mode_costs.skip_txfm_cost[skip_ctx][1];
      rd_stats->rate = s1;
    } else {
      const int s0 = x->mode_costs.skip_txfm_cost[skip_ctx][0];
      rd_stats->rate += s0;
    }
  }
  return rd;
}